

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
getShaderInitialization_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType)

{
  bool bVar1;
  ContextType ctxType;
  uint uVar2;
  ostringstream source;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    uVar2 = (int)ctx - 2;
    if (2 < uVar2) goto LAB_016449ad;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01cc6498 + *(int *)(&DAT_01cc6498 + (ulong)uVar2 * 4),
               *(long *)(&DAT_01cc64a8 + (ulong)uVar2 * 8));
  }
  uVar2 = (int)ctx - 2;
  if (uVar2 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01cc6470 + *(int *)(&DAT_01cc6470 + (ulong)uVar2 * 4),
               *(long *)(&DAT_01cc6480 + (ulong)uVar2 * 8));
  }
LAB_016449ad:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderInitialization (NegativeTestContext& ctx, glu::ShaderType shaderType)
{
	std::ostringstream source;

	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_GEOMETRY:
				source << "#extension GL_EXT_geometry_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_CONTROL:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_EVALUATION:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			default:
				break;
		}
	}

	switch (shaderType)
	{
		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(max_vertices = 5) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "layout(vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "layout(triangles, equal_spacing, cw) in;\n";
			break;

		default:
			break;
	}

	return source.str();
}